

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void arrayminmax(double *x,int N,double *amin,double *amax)

{
  ulong uVar1;
  double dVar2;
  
  *amax = -1.79769313486232e+308;
  *amin = 1.79769313486232e+308;
  if (0 < N) {
    uVar1 = 0;
    do {
      dVar2 = x[uVar1];
      if (x[uVar1] <= *amax) {
        dVar2 = *amax;
      }
      *amax = dVar2;
      dVar2 = x[uVar1];
      if (*amin <= x[uVar1]) {
        dVar2 = *amin;
      }
      *amin = dVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

void arrayminmax(double *x, int N, double *amin,double *amax) {
	int i;
	*amax = - DBL_MAX;
	*amin = DBL_MAX;

	for(i = 0; i < N;++i) {
		*amax = x[i] > *amax ? x[i] : *amax;
		*amin = x[i] < *amin ? x[i] : *amin;
	}

}